

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::ParseAddtlInfo_SnapSetInfo
               (SnapObject *snpObject,FileReader *reader,SlabAllocator *alloc)

{
  uint32 uVar1;
  SnapSetInfo *addtlInfo;
  void **ppvVar2;
  TTDVar pvVar3;
  uint32 i;
  ulong uVar4;
  
  addtlInfo = (SnapSetInfo *)SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
  uVar1 = FileReader::ReadLengthValue(reader,true);
  addtlInfo->SetSize = uVar1;
  if (uVar1 == 0) {
    addtlInfo->SetValueArray = (TTDVar *)0x0;
  }
  else {
    ppvVar2 = SlabAllocatorBase<0>::SlabAllocateArray<void*>(alloc,(ulong)uVar1);
    addtlInfo->SetValueArray = ppvVar2;
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    for (uVar4 = 0; uVar4 < addtlInfo->SetSize; uVar4 = uVar4 + 1) {
      pvVar3 = NSSnapValues::ParseTTDVar(uVar4 != 0,reader);
      addtlInfo->SetValueArray[uVar4] = pvVar3;
    }
    (*reader->_vptr_FileReader[5])(reader);
  }
  SnapObjectSetAddtlInfoAs<TTD::NSSnapObjects::SnapSetInfo*,(TTD::NSSnapObjects::SnapObjectType)25>
            (snpObject,addtlInfo);
  return;
}

Assistant:

void ParseAddtlInfo_SnapSetInfo(SnapObject* snpObject, FileReader* reader, SlabAllocator& alloc)
        {
            SnapSetInfo* setInfo = alloc.SlabAllocateStruct<SnapSetInfo>();

            setInfo->SetSize = reader->ReadLengthValue(true);
            if(setInfo->SetSize == 0)
            {
                setInfo->SetValueArray = nullptr;
            }
            else
            {
                setInfo->SetValueArray = alloc.SlabAllocateArray<TTDVar>(setInfo->SetSize);

                reader->ReadSequenceStart_WDefaultKey(true);
                for(uint32 i = 0; i < setInfo->SetSize; ++i)
                {
                    setInfo->SetValueArray[i] = NSSnapValues::ParseTTDVar(i != 0, reader);
                }
                reader->ReadSequenceEnd();
            }

            SnapObjectSetAddtlInfoAs<SnapSetInfo*, SnapObjectType::SnapSetObject>(snpObject, setInfo);
        }